

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

void LenPriceEnc_UpdateTables(CLenPriceEnc *p,uint numPosStates,CLenEnc *enc,CProbPrice *ProbPrices)

{
  int iVar1;
  UInt32 startPrice;
  CProbPrice CVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  UInt32 *pUVar9;
  ulong uVar10;
  long lVar11;
  
  uVar5 = enc->low[0] >> 2 & 0xfffffffc;
  iVar1 = *(int *)((long)ProbPrices + (ulong)(uVar5 ^ 0x1fc));
  if (numPosStates != 0) {
    startPrice = *(UInt32 *)((long)ProbPrices + (ulong)uVar5);
    CVar2 = ProbPrices[enc->low[8] >> 4];
    pUVar9 = p->prices[0] + 8;
    uVar10 = 0;
    do {
      SetPrices_3(enc->low + (uVar10 & 0xffffffff),startPrice,(UInt32 *)(pUVar9 + -8),ProbPrices);
      SetPrices_3(enc->low + (uVar10 & 0xffffffff) + 8,CVar2 + iVar1,pUVar9,ProbPrices);
      uVar10 = uVar10 + 0x10;
      pUVar9 = pUVar9 + 0x110;
    } while ((ulong)numPosStates << 4 != uVar10);
  }
  uVar5 = p->tableSize;
  if (0x10 < uVar5) {
    pUVar9 = p->prices[0] + 0x10;
    uVar10 = (ulong)(uVar5 - 0xf >> 1);
    iVar3 = *(int *)((long)ProbPrices + (ulong)(enc->low[8] >> 2 & 0xfffffffc ^ 0x1fc));
    do {
      iVar7 = iVar1 + iVar3;
      uVar6 = (int)uVar10 + 0x7f;
      do {
        iVar7 = iVar7 + ProbPrices
                        [(-(uVar6 & 1) & 0x7f0 ^
                         (uint)*(ushort *)((long)enc->high + (ulong)(uVar6 & 0xfffffffe))) >> 4];
        bVar4 = 3 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar4);
      uVar6 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar6;
      uVar8 = enc->high[uVar10 + 0x80] >> 2 & 0xfffffffc;
      pUVar9[uVar10 * 2] = *(int *)((long)ProbPrices + (ulong)uVar8) + iVar7;
      p->prices[0][uVar10 * 2 + 0x11] = iVar7 + *(int *)((long)ProbPrices + (ulong)(uVar8 ^ 0x1fc));
    } while (uVar6 != 0);
    if (1 < numPosStates) {
      lVar11 = 0;
      do {
        memcpy((void *)((long)p->prices[1] + lVar11 + 0x40),pUVar9,(ulong)(uVar5 - 0x10) << 2);
        lVar11 = lVar11 + 0x440;
      } while ((ulong)numPosStates * 0x440 + -0x440 != lVar11);
    }
  }
  return;
}

Assistant:

Z7_FASTCALL LenPriceEnc_UpdateTables(
    CLenPriceEnc *p,
    unsigned numPosStates,
    const CLenEnc *enc,
    const CProbPrice *ProbPrices)
{
  UInt32 b;
 
  {
    unsigned prob = enc->low[0];
    UInt32 a, c;
    unsigned posState;
    b = GET_PRICEa_1(prob);
    a = GET_PRICEa_0(prob);
    c = b + GET_PRICEa_0(enc->low[kLenNumLowSymbols]);
    for (posState = 0; posState < numPosStates; posState++)
    {
      UInt32 *prices = p->prices[posState];
      const CLzmaProb *probs = enc->low + (posState << (1 + kLenNumLowBits));
      SetPrices_3(probs, a, prices, ProbPrices);
      SetPrices_3(probs + kLenNumLowSymbols, c, prices + kLenNumLowSymbols, ProbPrices);
    }
  }

  /*
  {
    unsigned i;
    UInt32 b;
    a = GET_PRICEa_0(enc->low[0]);
    for (i = 0; i < kLenNumLowSymbols; i++)
      p->prices2[i] = a;
    a = GET_PRICEa_1(enc->low[0]);
    b = a + GET_PRICEa_0(enc->low[kLenNumLowSymbols]);
    for (i = kLenNumLowSymbols; i < kLenNumLowSymbols * 2; i++)
      p->prices2[i] = b;
    a += GET_PRICEa_1(enc->low[kLenNumLowSymbols]);
  }
  */
 
  // p->counter = numSymbols;
  // p->counter = 64;

  {
    unsigned i = p->tableSize;
    
    if (i > kLenNumLowSymbols * 2)
    {
      const CLzmaProb *probs = enc->high;
      UInt32 *prices = p->prices[0] + kLenNumLowSymbols * 2;
      i -= kLenNumLowSymbols * 2 - 1;
      i >>= 1;
      b += GET_PRICEa_1(enc->low[kLenNumLowSymbols]);
      do
      {
        /*
        p->prices2[i] = a +
        // RcTree_GetPrice(enc->high, kLenNumHighBits, i - kLenNumLowSymbols * 2, ProbPrices);
        LitEnc_GetPrice(probs, i - kLenNumLowSymbols * 2, ProbPrices);
        */
        // UInt32 price = a + RcTree_GetPrice(probs, kLenNumHighBits - 1, sym, ProbPrices);
        unsigned sym = --i + (1 << (kLenNumHighBits - 1));
        UInt32 price = b;
        do
        {
          const unsigned bit = sym & 1;
          sym >>= 1;
          price += GET_PRICEa(probs[sym], bit);
        }
        while (sym >= 2);

        {
          const unsigned prob = probs[(size_t)i + (1 << (kLenNumHighBits - 1))];
          prices[(size_t)i * 2    ] = price + GET_PRICEa_0(prob);
          prices[(size_t)i * 2 + 1] = price + GET_PRICEa_1(prob);
        }
      }
      while (i);

      {
        unsigned posState;
        const size_t num = (p->tableSize - kLenNumLowSymbols * 2) * sizeof(p->prices[0][0]);
        for (posState = 1; posState < numPosStates; posState++)
          memcpy(p->prices[posState] + kLenNumLowSymbols * 2, p->prices[0] + kLenNumLowSymbols * 2, num);
      }
    }
  }
}